

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O1

int __thiscall DatabaseName::derive(DatabaseName *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  string local_c8;
  string local_a8;
  string local_88;
  path local_68;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&local_68,(path *)ctx);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,*(long *)key,*(long *)(key + 8) + *(long *)key);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,*(long *)(ctx + 0x60),*(long *)(ctx + 0x68) + *(long *)(ctx + 0x60)
            );
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,*keylen,keylen[1] + *keylen);
  DatabaseName(this,&local_68,&local_88,&local_a8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  return (int)this;
}

Assistant:

DatabaseName DatabaseName::derive(const std::string &new_type,
                                  const std::string &new_filename) const {
    return DatabaseName(db_base, new_type, id, new_filename);
}